

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O1

void __thiscall mjs::gc_heap::pointer_set::erase(pointer_set *this,gc_heap_ptr_untyped *p)

{
  gc_heap_ptr_untyped **ppgVar1;
  gc_heap_ptr_untyped *pgVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  gc_heap_ptr_untyped *__tmp;
  
  ppgVar1 = this->set_;
  uVar5 = (ulong)this->size_;
  do {
    uVar4 = uVar5;
    uVar5 = uVar4 - 1;
    if (uVar4 == 0) goto LAB_00127262;
    pgVar2 = ppgVar1[uVar5];
  } while (pgVar2 != p);
  uVar3 = this->size_ - 1;
  this->size_ = uVar3;
  ppgVar1[uVar5] = ppgVar1[uVar3];
  ppgVar1[uVar3] = pgVar2;
  if (uVar4 != 0) {
    return;
  }
LAB_00127262:
  __assert_fail("!\"Pointer not found in set!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x10a,"void mjs::gc_heap::pointer_set::erase(const gc_heap_ptr_untyped &)");
}

Assistant:

void erase(const gc_heap_ptr_untyped& p) {
            // Search from the back since objects tend to be short lived
            for (uint32_t i = size_; i--;) {
                if (set_[i] == &p) {
                    std::swap(set_[i], set_[--size_]);
                    return;
                }
            }
            assert(!"Pointer not found in set!");
        }